

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symlink.cpp
# Opt level: O0

string * fs_read_symlink_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view path_00;
  bool bVar1;
  error_code eVar2;
  string_view local_b0;
  error_category *local_a0;
  char *local_98;
  uint local_90;
  path local_80;
  undefined1 local_58 [8];
  path p;
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  eVar2 = std::make_error_code(invalid_argument);
  ec._0_8_ = eVar2._M_cat;
  p._32_4_ = eVar2._M_value;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  std::filesystem::read_symlink((path *)local_58,(error_code *)&local_80);
  std::filesystem::__cxx11::path::~path(&local_80);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&p._M_cmpts);
  if (!bVar1) {
    std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,(path *)local_58);
  }
  local_90 = (uint)!bVar1;
  std::filesystem::__cxx11::path::~path((path *)local_58);
  if (local_90 == 0) {
    local_a0 = ec._M_cat;
    local_98 = path._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b0,"fs_read_symlink");
    path_00._M_str = local_98;
    path_00._M_len = (size_t)local_a0;
    fs_print_error(path_00,local_b0,(error_code *)&p._M_cmpts);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_read_symlink(std::string_view path)
{
  // read the target of a symlink

  std::error_code ec = std::make_error_code(std::errc::invalid_argument);

#if defined(__MINGW32__) || (defined(_WIN32) && !defined(HAVE_CXX_FILESYSTEM))
  if(fs_is_symlink(path))
    return fs_win32_final_path(path);
#elif defined(HAVE_CXX_FILESYSTEM)
  if(auto p = std::filesystem::read_symlink(path, ec); !ec) FFS_LIKELY
    return p.generic_string();
#else
  // https://www.man7.org/linux/man-pages/man2/readlink.2.html
  std::string r(fs_get_max_path(), '\0');

  if (ssize_t Lr = readlink(path.data(), r.data(), r.size()); Lr > 0){
    // readlink() does not null-terminate the result
    r.resize(Lr);
    return r;
  }
#endif

  fs_print_error(path, __func__, ec);
  return {};
}